

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

LogicalType * duckdb::DBConfig::ParseLogicalType(LogicalType *__return_storage_ptr__,string *type)

{
  pointer pcVar1;
  bool bVar2;
  LogicalTypeId id;
  long lVar3;
  reference pvVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  InternalException *pIVar6;
  idx_t index;
  int iVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  string map_args;
  LogicalType *type_id;
  child_list_t<LogicalType> union_members;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  map_args_vect;
  LogicalType value_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  union_member_parts;
  LogicalType key_type;
  LogicalType child_type;
  LogicalType value_type_1;
  LogicalType value_type_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_388;
  LogicalType *local_350;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_348;
  undefined1 local_328 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_2e8;
  string local_2c8;
  string local_2a8;
  LogicalType local_288;
  optional_idx local_270;
  child_list_t<LogicalType> local_268;
  child_list_t<LogicalType> local_250;
  LogicalType local_238;
  LogicalType local_220;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  LogicalType local_48;
  
  local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
  local_350 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"[]","");
  bVar2 = StringUtil::EndsWith(type,&local_388.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
    operator_delete(local_388.first._M_dataplus._M_p);
  }
  if (bVar2) {
    ::std::__cxx11::string::substr((ulong)&local_388,(ulong)type);
    ParseLogicalType((LogicalType *)&local_2a8,&local_388.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
      operator_delete(local_388.first._M_dataplus._M_p);
    }
    LogicalType::LIST(local_350,(LogicalType *)&local_2a8);
  }
  else {
    local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"]","");
    bVar2 = StringUtil::EndsWith(type,&local_388.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
      operator_delete(local_388.first._M_dataplus._M_p);
    }
    if (!bVar2) {
      pcVar1 = (type->_M_dataplus)._M_p;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,pcVar1,pcVar1 + type->_M_string_length);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"MAP(","");
      bVar2 = StringUtil::StartsWith(&local_168,&local_188);
      if (bVar2) {
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,")","");
        bVar2 = StringUtil::EndsWith(type,&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if (bVar2 == false) {
        pcVar1 = (type->_M_dataplus)._M_p;
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar1,pcVar1 + type->_M_string_length);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"UNION(","");
        bVar2 = StringUtil::StartsWith(&local_1a8,&local_1c8);
        if (bVar2) {
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,")","");
          bVar2 = StringUtil::EndsWith(type,&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        if (bVar2 == false) {
          pcVar1 = (type->_M_dataplus)._M_p;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar1,pcVar1 + type->_M_string_length);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"STRUCT(","");
          bVar2 = StringUtil::StartsWith(&local_1e8,&local_208);
          if (bVar2) {
            local_328._0_8_ = local_328 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,")","");
            bVar2 = StringUtil::EndsWith(type,(string *)local_328);
            if ((pointer)local_328._0_8_ != (pointer)(local_328 + 0x10)) {
              operator_delete((void *)local_328._0_8_);
            }
          }
          else {
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p);
          }
          if (bVar2 == false) {
            local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ANY","");
            bVar2 = StringUtil::CIEquals(type,&local_388.first);
            id = ANY;
            if (!bVar2) {
              id = TransformStringToLogicalTypeId(type);
            }
            LogicalType::LogicalType(local_350,id);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
              operator_delete(local_388.first._M_dataplus._M_p);
            }
            LogicalType::LogicalType((LogicalType *)&local_388,USER);
            bVar2 = LogicalType::operator==(local_350,(LogicalType *)&local_388);
            LogicalType::~LogicalType((LogicalType *)&local_388);
            if (!bVar2) {
              return local_350;
            }
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_388,
                       "Error while generating extension function overloads - unrecognized logical type %s"
                       ,"");
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            pcVar1 = (type->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,pcVar1,pcVar1 + type->_M_string_length);
            InternalException::InternalException<std::__cxx11::string>
                      (pIVar6,&local_388.first,&local_148);
            __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::substr((ulong)&local_308,(ulong)type);
          StringUtil::SplitWithParentheses
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_348,(string *)&local_308,',','(',')');
          local_2e8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2e8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2e8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_348.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_348.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            sVar9 = 0;
            do {
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_348,sVar9);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_348,sVar9);
              StringUtil::SplitWithParentheses
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)&local_288,pvVar4,' ','(',')');
              if ((long)local_288.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  - local_288._0_8_ != 0x40) {
                pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
                local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_388,"Ill formatted struct type: %s","");
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                pcVar1 = (type->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_128,pcVar1,pcVar1 + type->_M_string_length);
                InternalException::InternalException<std::__cxx11::string>
                          (pIVar6,&local_388.first,&local_128);
                __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error
                           );
              }
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_288,0);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_288,1);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_288,1);
              ParseLogicalType(&local_48,pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_288,0);
              ::std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                          *)&local_388,pvVar4,&local_48);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)&local_2e8,&local_388);
              LogicalType::~LogicalType(&local_388.second);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
                operator_delete(local_388.first._M_dataplus._M_p);
              }
              LogicalType::~LogicalType(&local_48);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_288);
              sVar9 = sVar9 + 1;
            } while (sVar9 < (ulong)((long)local_348.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_348.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_268,&local_2e8);
          LogicalType::STRUCT(local_350,&local_268);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_268);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_2e8);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_348);
          paVar5 = &local_2f8;
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_328,(ulong)type);
          StringUtil::SplitWithParentheses
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_308,(string *)local_328,',','(',')');
          local_348.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_348.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_348.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_308._8_8_ != local_308._M_allocated_capacity) {
            sVar9 = 0;
            do {
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_308,sVar9);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_308,sVar9);
              StringUtil::SplitWithParentheses
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)&local_2e8,pvVar4,' ','(',')');
              if ((long)local_2e8.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2e8.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
                local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_388,"Ill formatted union type: %s","");
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                pcVar1 = (type->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e8,pcVar1,pcVar1 + type->_M_string_length);
                InternalException::InternalException<std::__cxx11::string>
                          (pIVar6,&local_388.first,&local_e8);
                __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error
                           );
              }
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_2e8,0);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_2e8,1);
              StringUtil::Trim(pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_2e8,1);
              ParseLogicalType(&local_288,pvVar4);
              pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     *)&local_2e8,0);
              ::std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                          *)&local_388,pvVar4,&local_288);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)&local_348,&local_388);
              LogicalType::~LogicalType(&local_388.second);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
                operator_delete(local_388.first._M_dataplus._M_p);
              }
              LogicalType::~LogicalType(&local_288);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e8);
              sVar9 = sVar9 + 1;
            } while (sVar9 < (ulong)((long)(local_308._8_8_ - local_308._0_8_) >> 5));
          }
          if ((local_348.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_348.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (0x100 < (ulong)(((long)local_348.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_348.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7))) {
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_388,"Invalid number of union members: \'%s\'","");
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            pcVar1 = (type->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_108,pcVar1,pcVar1 + type->_M_string_length);
            InternalException::InternalException<std::__cxx11::string>
                      (pIVar6,&local_388.first,&local_108);
            __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_250,&local_348);
          LogicalType::UNION(local_350,&local_250);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_250);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_348);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_308._M_local_buf);
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_328 + 0x10);
        }
        _Var8._M_p = *(pointer *)(paVar5->_M_local_buf + -0x10);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_388,(ulong)type);
        StringUtil::SplitWithParentheses
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_328,&local_388.first,',','(',')');
        if (local_328._8_8_ - local_328._0_8_ != 0x40) {
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"Ill formatted map type: \'%s\'","");
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar1 = (type->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar1,pcVar1 + type->_M_string_length);
          InternalException::InternalException<std::__cxx11::string>(pIVar6,&local_2c8,&local_c8);
          __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_328,0);
        StringUtil::Trim(pvVar4);
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_328,1);
        StringUtil::Trim(pvVar4);
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_328,0);
        ParseLogicalType((LogicalType *)&local_2c8,pvVar4);
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)local_328,1);
        ParseLogicalType((LogicalType *)&local_308,pvVar4);
        LogicalType::LogicalType(&local_220,(LogicalType *)&local_2c8);
        LogicalType::LogicalType(&local_238,(LogicalType *)&local_308);
        LogicalType::MAP(local_350,&local_220,&local_238);
        LogicalType::~LogicalType(&local_238);
        LogicalType::~LogicalType(&local_220);
        LogicalType::~LogicalType((LogicalType *)&local_308);
        LogicalType::~LogicalType((LogicalType *)&local_2c8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_328);
        paVar5 = &local_388.first.field_2;
        _Var8._M_p = local_388.first._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p == paVar5) {
        return local_350;
      }
      operator_delete(_Var8._M_p);
      return local_350;
    }
    lVar3 = ::std::__cxx11::string::rfind((char)type,0x5b);
    if (lVar3 + 1U < 2) {
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"Ill formatted type: \'%s\'","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar1 = (type->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + type->_M_string_length);
      InternalException::InternalException<std::__cxx11::string>(pIVar6,&local_388.first,&local_68);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (lVar3 + 1U < type->_M_string_length - 1) {
      index = 0;
      do {
        iVar7 = (int)(type->_M_dataplus)._M_p[lVar3 + 1];
        if (9 < iVar7 - 0x30U) {
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_388,"Ill formatted array type: \'%s\'","");
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          pcVar1 = (type->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar1,pcVar1 + type->_M_string_length);
          InternalException::InternalException<std::__cxx11::string>
                    (pIVar6,&local_388.first,&local_88);
          __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        index = ((long)iVar7 + index * 10) - 0x30;
        lVar3 = lVar3 + 1;
      } while (type->_M_string_length - 2 != lVar3);
    }
    else {
      index = 0;
    }
    if (index - 0x186a1 < 0xfffffffffffe7960) {
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      local_388.first._M_dataplus._M_p = (pointer)&local_388.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"Invalid array size: \'%s\'","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar1 = (type->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,pcVar1 + type->_M_string_length);
      InternalException::InternalException<std::__cxx11::string>(pIVar6,&local_388.first,&local_a8);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::substr((ulong)&local_388,(ulong)type);
    ParseLogicalType((LogicalType *)&local_2a8,&local_388.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388.first._M_dataplus._M_p != &local_388.first.field_2) {
      operator_delete(local_388.first._M_dataplus._M_p);
    }
    optional_idx::optional_idx(&local_270,index);
    LogicalType::ARRAY(local_350,(LogicalType *)&local_2a8,local_270);
  }
  LogicalType::~LogicalType((LogicalType *)&local_2a8);
  return local_350;
}

Assistant:

LogicalType DBConfig::ParseLogicalType(const string &type) {
	if (StringUtil::EndsWith(type, "[]")) {
		// list - recurse
		auto child_type = ParseLogicalType(type.substr(0, type.size() - 2));
		return LogicalType::LIST(child_type);
	}

	if (StringUtil::EndsWith(type, "]")) {
		// array - recurse
		auto bracket_open_idx = type.rfind('[');
		if (bracket_open_idx == DConstants::INVALID_INDEX || bracket_open_idx == 0) {
			throw InternalException("Ill formatted type: '%s'", type);
		}
		idx_t array_size = 0;
		for (auto length_idx = bracket_open_idx + 1; length_idx < type.size() - 1; length_idx++) {
			if (!isdigit(type[length_idx])) {
				throw InternalException("Ill formatted array type: '%s'", type);
			}
			array_size = array_size * 10 + static_cast<idx_t>(type[length_idx] - '0');
		}
		if (array_size == 0 || array_size > ArrayType::MAX_ARRAY_SIZE) {
			throw InternalException("Invalid array size: '%s'", type);
		}
		auto child_type = ParseLogicalType(type.substr(0, bracket_open_idx));
		return LogicalType::ARRAY(child_type, array_size);
	}

	if (StringUtil::StartsWith(type, "MAP(") && StringUtil::EndsWith(type, ")")) {
		// map - recurse
		string map_args = type.substr(4, type.size() - 5);
		vector<string> map_args_vect = StringUtil::SplitWithParentheses(map_args);
		if (map_args_vect.size() != 2) {
			throw InternalException("Ill formatted map type: '%s'", type);
		}
		StringUtil::Trim(map_args_vect[0]);
		StringUtil::Trim(map_args_vect[1]);
		auto key_type = ParseLogicalType(map_args_vect[0]);
		auto value_type = ParseLogicalType(map_args_vect[1]);
		return LogicalType::MAP(key_type, value_type);
	}

	if (StringUtil::StartsWith(type, "UNION(") && StringUtil::EndsWith(type, ")")) {
		// union - recurse
		string union_members_str = type.substr(6, type.size() - 7);
		vector<string> union_members_vect = StringUtil::SplitWithParentheses(union_members_str);
		child_list_t<LogicalType> union_members;
		for (idx_t member_idx = 0; member_idx < union_members_vect.size(); member_idx++) {
			StringUtil::Trim(union_members_vect[member_idx]);
			vector<string> union_member_parts = StringUtil::SplitWithParentheses(union_members_vect[member_idx], ' ');
			if (union_member_parts.size() != 2) {
				throw InternalException("Ill formatted union type: %s", type);
			}
			StringUtil::Trim(union_member_parts[0]);
			StringUtil::Trim(union_member_parts[1]);
			auto value_type = ParseLogicalType(union_member_parts[1]);
			union_members.emplace_back(make_pair(union_member_parts[0], value_type));
		}
		if (union_members.empty() || union_members.size() > UnionType::MAX_UNION_MEMBERS) {
			throw InternalException("Invalid number of union members: '%s'", type);
		}
		return LogicalType::UNION(union_members);
	}

	if (StringUtil::StartsWith(type, "STRUCT(") && StringUtil::EndsWith(type, ")")) {
		// struct - recurse
		string struct_members_str = type.substr(7, type.size() - 8);
		vector<string> struct_members_vect = StringUtil::SplitWithParentheses(struct_members_str);
		child_list_t<LogicalType> struct_members;
		for (idx_t member_idx = 0; member_idx < struct_members_vect.size(); member_idx++) {
			StringUtil::Trim(struct_members_vect[member_idx]);
			vector<string> struct_member_parts = StringUtil::SplitWithParentheses(struct_members_vect[member_idx], ' ');
			if (struct_member_parts.size() != 2) {
				throw InternalException("Ill formatted struct type: %s", type);
			}
			StringUtil::Trim(struct_member_parts[0]);
			StringUtil::Trim(struct_member_parts[1]);
			auto value_type = ParseLogicalType(struct_member_parts[1]);
			struct_members.emplace_back(make_pair(struct_member_parts[0], value_type));
		}
		return LogicalType::STRUCT(struct_members);
	}

	LogicalType type_id = StringUtil::CIEquals(type, "ANY") ? LogicalType::ANY : TransformStringToLogicalTypeId(type);
	if (type_id == LogicalTypeId::USER) {
		throw InternalException("Error while generating extension function overloads - unrecognized logical type %s",
		                        type);
	}
	return type_id;
}